

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O2

bool FastPForLib::Simple16<false>::tryme<7u,1u,7u,2u,7u,1u>(uint32_t *n,size_t len)

{
  uint *puVar1;
  uint32_t i_1;
  ulong uVar2;
  ulong uVar3;
  uint32_t i;
  uint uVar4;
  ulong uVar5;
  ulong uVar7;
  bool bVar8;
  ulong uVar6;
  
  uVar3 = 7;
  uVar2 = uVar3;
  if (len < 7) {
    uVar2 = len;
  }
  uVar5 = 0;
  while (uVar2 != uVar5) {
    puVar1 = n + uVar5;
    uVar5 = uVar5 + 1;
    if (1 < *puVar1) {
      return false;
    }
  }
  uVar7 = len - uVar2;
  uVar5 = uVar3;
  if (uVar7 < 7) {
    uVar5 = uVar7;
  }
  uVar4 = (int)uVar5 + (int)uVar2;
  uVar6 = (ulong)uVar4;
  do {
    if (uVar6 <= uVar2) {
      if (uVar7 - uVar5 < 7) {
        uVar3 = uVar7 - uVar5;
      }
      do {
        bVar8 = (int)uVar3 + uVar4 <= uVar6;
        if (bVar8) {
          return bVar8;
        }
        puVar1 = n + uVar6;
        uVar6 = uVar6 + 1;
      } while (*puVar1 < 2);
      return bVar8;
    }
    puVar1 = n + uVar2;
    uVar2 = uVar2 + 1;
  } while (*puVar1 < 4);
  return false;
}

Assistant:

static bool tryme(const uint32_t *n, size_t len) {
    const uint32_t min1 = (len < num1) ? static_cast<uint32_t>(len) : num1;
    for (uint32_t i = 0; i < min1; i++) {
      if ((n[i]) >= (1U << log1))
        return false;
    }
    len -= min1;
    const uint32_t min2 = (len < num2) ? static_cast<uint32_t>(len) : num2;

    for (uint32_t i = min1; i < min1 + min2; i++) {
      if ((n[i]) >= (1U << log2))
        return false;
    }
    len -= min2;
    const uint32_t min3 = static_cast<uint32_t>((len < num3) ? len : num3);
    for (uint32_t i = min1 + min2; i < min1 + min2 + min3; i++) {
      if ((n[i]) >= (1U << log3))
        return false;
    }
    return true;
  }